

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_CELL ref_cell;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_INT new_cell;
  REF_INT node3;
  REF_INT node2;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_INT nodes [27];
  REF_INT local_c0;
  REF_INT local_bc;
  REF_INT local_b8;
  REF_INT local_b4;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  ref_cell = ref_grid->cell[3];
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&local_b8,&local_bc);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_ac,&local_b4);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b3,
             "ref_swap_tri_edge",(ulong)uVar1,"more then two");
      return uVar1;
    }
    lVar4 = (long)local_ac;
    if (lVar4 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b4,
             "ref_swap_tri_edge","there should be two triangles for manifold",2,lVar4);
    }
    if (local_ac != 2) {
      return (uint)(lVar4 != 2);
    }
    uVar1 = ref_cell_nodes(ref_cell,local_b4,&local_a8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b5,
             "ref_swap_tri_edge",(ulong)uVar1,"nodes tri0");
      return uVar1;
    }
    uVar1 = ref_cell_remove(ref_cell,local_b4);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b6,
             "ref_swap_tri_edge",(ulong)uVar1,"remove");
      return uVar1;
    }
    uVar1 = ref_cell_remove(ref_cell,local_b0);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b7,
             "ref_swap_tri_edge",(ulong)uVar1,"remove");
      return uVar1;
    }
    local_a4 = local_bc;
    local_a0 = local_b8;
    local_a8 = node0;
    uVar1 = ref_cell_add(ref_cell,&local_a8,&local_c0);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",700,
             "ref_swap_tri_edge",(ulong)uVar1,"add node0 version");
      return uVar1;
    }
    local_a4 = local_b8;
    local_a0 = local_bc;
    local_a8 = node1;
    uVar1 = ref_cell_add(ref_cell,&local_a8,&local_c0);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar3 = "add node0 version";
    uVar2 = 0x2c0;
  }
  else {
    pcVar3 = "other nodes";
    uVar2 = 0x2b0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar2,
         "ref_swap_tri_edge",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_INT new_cell;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[0]), "remove");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[1]), "remove");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");

  return REF_SUCCESS;
}